

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAdsPerformance::Read(TestAdsPerformance *this,size_t numLoops)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  test_root local_e0;
  test_root local_c0;
  test_root local_a0;
  test_root local_80;
  ulong local_60;
  size_t i;
  uint local_50;
  uint32_t buffer;
  uint32_t bytesRead;
  test_root local_40;
  long local_20;
  long port;
  size_t numLoops_local;
  TestAdsPerformance *this_local;
  
  port = numLoops;
  numLoops_local = (size_t)this;
  local_20 = AdsPortOpenEx();
  bVar3 = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3a5);
  std::__cxx11::string::~string((string *)&local_40);
  do {
    for (local_60 = 0; local_60 < (ulong)port; local_60 = local_60 + 1) {
      fructose::test_root::set_assertion_tested((test_root *)this);
      lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,(void *)((long)&i + 4),
                                &local_50);
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      if ((lVar1 == 0) == bVar3) {
        poVar2 = std::operator<<((ostream *)&std::cout,"i");
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
        std::operator<<(poVar2,"\n");
        bVar3 = fructose::test_root::reverse_mode((test_root *)this);
        fructose::test_root::get_test_name_abi_cxx11_(&local_80);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar3,(string *)&local_80,
                   "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3ad);
        std::__cxx11::string::~string((string *)&local_80);
      }
      fructose::test_root::set_assertion_tested((test_root *)this);
      bVar4 = local_50 == 4;
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      if (bVar4 == bVar3) {
        poVar2 = std::operator<<((ostream *)&std::cout,"i");
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
        std::operator<<(poVar2,"\n");
        bVar3 = fructose::test_root::reverse_mode((test_root *)this);
        fructose::test_root::get_test_name_abi_cxx11_(&local_a0);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar3,(string *)&local_a0,"sizeof(buffer) == bytesRead",
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3ae);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      fructose::test_root::set_assertion_tested((test_root *)this);
      bVar4 = i._4_4_ == 0;
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      if (bVar4 == bVar3) {
        poVar2 = std::operator<<((ostream *)&std::cout,"i");
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
        std::operator<<(poVar2,"\n");
        bVar3 = fructose::test_root::reverse_mode((test_root *)this);
        fructose::test_root::get_test_name_abi_cxx11_(&local_c0);
        fructose::test_root::test_assert
                  ((test_root *)this,bVar3,(string *)&local_c0,"0 == buffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                   ,0x3af);
        std::__cxx11::string::~string((string *)&local_c0);
      }
    }
  } while ((this->runEndurance & 1U) != 0);
  lVar1 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_e0);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_e0,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x3b2);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void Read(const size_t numLoops)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        uint32_t bytesRead;
        uint32_t buffer;
        do {
            for (size_t i = 0; i < numLoops; ++i) {
                fructose_loop_assert(i,
                                     0 ==
                                     AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
                fructose_loop_assert(i, sizeof(buffer) == bytesRead);
                fructose_loop_assert(i, 0 == buffer);
            }
        } while (runEndurance);
        fructose_assert(0 == AdsPortCloseEx(port));
    }